

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteAsciiHeader(FBXExporter *this)

{
  element_type *peVar1;
  ostream *poVar2;
  string ascii_header;
  stringstream head;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&head);
  poVar2 = std::operator<<(local_188,"; FBX ");
  poVar2 = std::operator<<(poVar2,(string *)FBX::EXPORT_VERSION_STR_abi_cxx11_);
  std::operator<<(poVar2," project file\n");
  std::operator<<(local_188,"; Created by the Open Asset Import Library (Assimp)\n");
  std::operator<<(local_188,"; http://assimp.org\n");
  std::operator<<(local_188,"; -------------------------------------------------\n");
  std::__cxx11::stringbuf::str();
  peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IOStream[3])(peVar1,ascii_header._M_dataplus._M_p,ascii_header._M_string_length,1)
  ;
  std::__cxx11::string::~string((string *)&ascii_header);
  std::__cxx11::stringstream::~stringstream((stringstream *)&head);
  return;
}

Assistant:

void FBXExporter::WriteAsciiHeader()
{
    // basically just a comment at the top of the file
    std::stringstream head;
    head << "; FBX " << EXPORT_VERSION_STR << " project file\n";
    head << "; Created by the Open Asset Import Library (Assimp)\n";
    head << "; http://assimp.org\n";
    head << "; -------------------------------------------------\n";
    const std::string ascii_header = head.str();
    outfile->Write(ascii_header.c_str(), ascii_header.size(), 1);
}